

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser_unittest.cc
# Opt level: O0

void __thiscall
google::protobuf::compiler::anon_unknown_0::ParserTest_StopAfterSyntaxIdentifierWithErrors_Test::
TestBody(ParserTest_StopAfterSyntaxIdentifierWithErrors_Test *this)

{
  bool bVar1;
  pointer pPVar2;
  pointer input;
  char *pcVar3;
  char *in_R9;
  AssertHelper local_98;
  Message local_90;
  undefined1 local_88 [8];
  AssertionResult gtest_ar;
  AssertHelper local_58 [3];
  Message local_40;
  bool local_31;
  undefined1 local_30 [8];
  AssertionResult gtest_ar_;
  ParserTest_StopAfterSyntaxIdentifierWithErrors_Test *this_local;
  
  std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
            ((basic_string_view<char,_std::char_traits<char>_> *)&gtest_ar_.message_,
             "// blah\nsyntax = error;\n");
  ParserTest::SetupParser(&this->super_ParserTest,stack0xffffffffffffffe0);
  pPVar2 = std::
           unique_ptr<google::protobuf::compiler::Parser,_std::default_delete<google::protobuf::compiler::Parser>_>
           ::operator->(&(this->super_ParserTest).parser_);
  Parser::SetStopAfterSyntaxIdentifier(pPVar2,true);
  pPVar2 = std::
           unique_ptr<google::protobuf::compiler::Parser,_std::default_delete<google::protobuf::compiler::Parser>_>
           ::operator->(&(this->super_ParserTest).parser_);
  input = std::
          unique_ptr<google::protobuf::io::Tokenizer,_std::default_delete<google::protobuf::io::Tokenizer>_>
          ::get(&(this->super_ParserTest).input_);
  bVar1 = Parser::Parse(pPVar2,input,(FileDescriptorProto *)0x0);
  local_31 = (bool)((bVar1 ^ 0xffU) & 1);
  testing::AssertionResult::AssertionResult<bool>((AssertionResult *)local_30,&local_31,(type *)0x0)
  ;
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_30);
  if (!bVar1) {
    testing::Message::Message(&local_40);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)&gtest_ar.message_,(internal *)local_30,
               (AssertionResult *)"parser_->Parse(input_.get(), nullptr)","true","false",in_R9);
    pcVar3 = (char *)std::__cxx11::string::c_str();
    testing::internal::AssertHelper::AssertHelper
              (local_58,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/compiler/parser_unittest.cc"
               ,0xe1,pcVar3);
    testing::internal::AssertHelper::operator=(local_58,&local_40);
    testing::internal::AssertHelper::~AssertHelper(local_58);
    std::__cxx11::string::~string((string *)&gtest_ar.message_);
    testing::Message::~Message(&local_40);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_30);
  testing::internal::EqHelper::
  Compare<char[34],_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_nullptr>
            ((EqHelper *)local_88,"\"1:9: Expected syntax identifier.\\n\"","error_collector_.text_"
             ,(char (*) [34])"1:9: Expected syntax identifier.\n",
             &(this->super_ParserTest).error_collector_.text_);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_88);
  if (!bVar1) {
    testing::Message::Message(&local_90);
    pcVar3 = testing::AssertionResult::failure_message((AssertionResult *)local_88);
    testing::internal::AssertHelper::AssertHelper
              (&local_98,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/compiler/parser_unittest.cc"
               ,0xe2,pcVar3);
    testing::internal::AssertHelper::operator=(&local_98,&local_90);
    testing::internal::AssertHelper::~AssertHelper(&local_98);
    testing::Message::~Message(&local_90);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_88);
  return;
}

Assistant:

TEST_F(ParserTest, StopAfterSyntaxIdentifierWithErrors) {
  SetupParser(
      "// blah\n"
      "syntax = error;\n");
  parser_->SetStopAfterSyntaxIdentifier(true);
  EXPECT_FALSE(parser_->Parse(input_.get(), nullptr));
  EXPECT_EQ("1:9: Expected syntax identifier.\n", error_collector_.text_);
}